

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::GetterXsYs<unsigned_short>,_ImPlot::TransformerLinLin>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::GetterXsYs<unsigned_short>,_ImPlot::TransformerLinLin>
             *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  GetterXsYs<unsigned_short> *pGVar6;
  GetterXsYs<unsigned_short> *pGVar7;
  ImDrawVert *pIVar8;
  uint *puVar9;
  uint uVar10;
  long lVar11;
  ImPlotContext *gp;
  long lVar12;
  ImVec2 IVar13;
  double dVar14;
  ImVec2 IVar15;
  double dVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  pGVar6 = this->Getter1;
  pGVar7 = this->Getter2;
  iVar3 = pGVar6->Count;
  lVar12 = (long)(((pGVar6->Offset + prim + 1) % iVar3 + iVar3) % iVar3) * (long)pGVar6->Stride;
  iVar3 = this->Transformer->YAxis;
  iVar4 = pGVar7->Count;
  IVar13 = GImPlot->PixelRange[iVar3].Min;
  dVar14 = (double)IVar13.x;
  dVar16 = (double)IVar13.y;
  dVar1 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  dVar2 = GImPlot->CurrentPlot->YAxis[iVar3].Range.Min;
  lVar11 = (long)(((prim + 1 + pGVar7->Offset) % iVar4 + iVar4) % iVar4) * (long)pGVar7->Stride;
  IVar13.x = (float)(((double)*(ushort *)((long)pGVar6->Xs + lVar12) - dVar1) * GImPlot->Mx + dVar14
                    );
  IVar13.y = (float)(((double)*(ushort *)((long)pGVar6->Ys + lVar12) - dVar2) * GImPlot->My[iVar3] +
                    dVar16);
  IVar15.x = (float)(((double)*(ushort *)((long)pGVar7->Xs + lVar11) - dVar1) * GImPlot->Mx + dVar14
                    );
  IVar15.y = (float)(((double)*(ushort *)((long)pGVar7->Ys + lVar11) - dVar2) * GImPlot->My[iVar3] +
                    dVar16);
  fVar20 = (this->P12).x;
  fVar21 = (this->P12).y;
  fVar23 = (this->P11).x;
  fVar24 = (this->P11).y;
  fVar17 = IVar13.y * fVar23 - IVar13.x * fVar24;
  fVar25 = fVar20 * IVar15.y - fVar21 * IVar15.x;
  fVar23 = fVar23 - IVar13.x;
  fVar20 = fVar20 - IVar15.x;
  fVar22 = fVar21 - IVar15.y;
  fVar26 = fVar22 * fVar23 - (fVar24 - IVar13.y) * fVar20;
  auVar18._0_4_ = fVar17 * fVar20 - fVar25 * fVar23;
  auVar18._4_4_ = fVar17 * fVar22 - fVar25 * (fVar24 - IVar13.y);
  auVar18._8_4_ = IVar13.y * 0.0 - fVar21 * 0.0;
  auVar18._12_4_ = IVar13.y * 0.0 - fVar21 * 0.0;
  auVar19._4_4_ = fVar26;
  auVar19._0_4_ = fVar26;
  auVar19._8_4_ = fVar22;
  auVar19._12_4_ = fVar22;
  auVar19 = divps(auVar18,auVar19);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar8 = DrawList->_VtxWritePtr;
  pIVar8->col = this->Col;
  pIVar8[1].pos = IVar13;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar8 = DrawList->_VtxWritePtr;
  pIVar8[1].col = this->Col;
  pIVar8[2].pos = auVar19._0_8_;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar8 = DrawList->_VtxWritePtr;
  pIVar8[2].col = this->Col;
  pIVar8[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar8 = DrawList->_VtxWritePtr;
  pIVar8[3].col = this->Col;
  pIVar8[4].pos = IVar15;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar8 = DrawList->_VtxWritePtr;
  pIVar8[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar8 + 5;
  uVar5 = DrawList->_VtxCurrentIdx;
  puVar9 = DrawList->_IdxWritePtr;
  *puVar9 = uVar5;
  uVar10 = -(uint)(fVar21 < fVar24 && IVar13.y < IVar15.y || IVar15.y < IVar13.y && fVar24 < fVar21)
           & 1;
  puVar9[1] = uVar5 + uVar10 + 1;
  puVar9[2] = DrawList->_VtxCurrentIdx + 3;
  puVar9[3] = DrawList->_VtxCurrentIdx + 1;
  puVar9[4] = (uVar10 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar9[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar9 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  this->P11 = IVar13;
  this->P12 = IVar15;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }